

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_argsort(ggml_context *ctx,ggml_tensor *a,ggml_sort_order order)

{
  ggml_tensor *tensor;
  int32_t in_EDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int in_stack_ffffffffffffffd8;
  ggml_type in_stack_ffffffffffffffdc;
  ggml_context *in_stack_ffffffffffffffe0;
  
  if (0x7fffffff < in_RSI->ne[0]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x110d,"GGML_ASSERT(%s) failed","a->ne[0] <= INT32_MAX");
  }
  tensor = ggml_new_tensor(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                           in_stack_ffffffffffffffd8,(int64_t *)0x151abf);
  ggml_set_op_params_i32(tensor,0,in_EDX);
  tensor->op = GGML_OP_ARGSORT;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_argsort(
        struct ggml_context  * ctx,
        struct ggml_tensor   * a,
        enum ggml_sort_order   order) {
    GGML_ASSERT(a->ne[0] <= INT32_MAX);
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_I32, GGML_MAX_DIMS, a->ne);

    ggml_set_op_params_i32(result, 0, (int32_t) order);

    result->op     = GGML_OP_ARGSORT;
    result->src[0] = a;

    return result;
}